

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O3

void __thiscall
fill<128U,_5U,_buffer_layout_bfs>::operator()
          (fill<128U,_5U,_buffer_layout_bfs> *this,array<Stream,_128UL> *streams,uchar **buffer,
          array<unsigned_long,_128UL> *buffer_count)

{
  unsigned_long *puVar1;
  uchar *puVar2;
  unsigned_long *puVar3;
  size_t sVar4;
  int iVar5;
  ostream *poVar6;
  size_t sVar7;
  unsigned_long uVar8;
  uchar *__s2;
  long lVar9;
  unsigned_long uVar10;
  DI __d;
  fill<128U,_10U,_buffer_layout_bfs> local_64;
  fill<128U,_11U,_buffer_layout_bfs> local_63;
  fill<128U,_11U,_buffer_layout_bfs> local_62;
  fill<128U,_10U,_buffer_layout_bfs> local_61;
  unsigned_long *local_60;
  uchar **local_58;
  size_t local_50;
  array<Stream,_128UL> *local_48;
  long local_40;
  DI local_38;
  
  local_48 = streams;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"fill_inner",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", inner, I=",0xb);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  local_38.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  puVar1 = buffer_count->_M_elems + 10;
  local_60 = buffer_count->_M_elems + 0xb;
  local_58 = buffer + 0x50;
  local_50 = 0;
  local_40 = 0;
  do {
    uVar8 = *puVar1;
    if (uVar8 == 0) {
      fill<128U,_10U,_buffer_layout_bfs>::operator()(&local_61,local_48,buffer,buffer_count);
      uVar8 = *puVar1;
      if (uVar8 == 0) {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        lVar9 = local_40;
        sVar4 = local_50;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"left stream drained\n",0x14);
        sVar7 = -lVar9;
        lVar9 = -sVar4;
        uVar8 = *local_60;
        goto LAB_0015e725;
      }
    }
    uVar10 = *local_60;
    if (uVar10 == 0) {
      fill<128U,_11U,_buffer_layout_bfs>::operator()(&local_62,local_48,buffer,buffer_count);
      uVar10 = *local_60;
      if (uVar10 == 0) {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        lVar9 = local_40;
        sVar4 = local_50;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"right stream drained\n",0x15);
        sVar7 = -lVar9;
        lVar9 = -sVar4;
        uVar8 = *puVar1;
        goto LAB_0015e81b;
      }
      uVar8 = *puVar1;
    }
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"L:\'",3);
    puVar2 = buffer[-uVar8 + 0x170];
    if (puVar2 == (uchar *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen((char *)puVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)puVar2,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\', R:\'",6);
    puVar2 = buffer[-uVar10 + 400];
    if (puVar2 == (uchar *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen((char *)puVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)puVar2,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'\n",2);
    puVar2 = buffer[-uVar8 + 0x170];
    if (puVar2 == (uchar *)0x0) {
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
    }
    __s2 = buffer[-uVar10 + 400];
    if (__s2 == (uchar *)0x0) {
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar5 = strcmp((char *)puVar2,(char *)__s2);
    puVar3 = local_60;
    if (iVar5 < 1) {
      __s2 = puVar2;
      puVar3 = puVar1;
    }
    *puVar3 = *puVar3 - 1;
    buffer[local_50 + 0x50] = __s2;
    check_input(local_58,local_50);
    local_40 = local_40 + -8;
    local_50 = local_50 + 1;
  } while (local_50 != 0x40);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Done, buffer filled\n",0x14);
  buffer_count->_M_elems[5] = 0x40;
  goto LAB_0015e996;
LAB_0015e725:
  do {
    if (uVar8 == 0) {
      fill<128U,_11U,_buffer_layout_bfs>::operator()(&local_63,local_48,buffer,buffer_count);
      uVar8 = *local_60;
      if (uVar8 == 0) {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"both streams prematurely drained\n",0x21);
        memmove(buffer + lVar9 + 0x90,local_58,sVar7);
        buffer_count->_M_elems[5] = -lVar9;
        check_input((uchar **)((long)buffer + (0x480 - sVar7)),-lVar9);
        goto LAB_0015e996;
      }
    }
    *(uchar **)((long)buffer + sVar7 + 0x280) = buffer[400 - uVar8];
    uVar8 = uVar8 - 1;
    *local_60 = uVar8;
    lVar9 = lVar9 + -1;
    sVar7 = sVar7 + 8;
  } while (sVar7 != 0x200);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\tbuffer filled\n",0xf);
  buffer_count->_M_elems[5] = 0x40;
  check_input(local_58,0x40);
  goto LAB_0015e996;
LAB_0015e81b:
  do {
    if (uVar8 == 0) {
      fill<128U,_10U,_buffer_layout_bfs>::operator()(&local_64,local_48,buffer,buffer_count);
      uVar8 = *puVar1;
      if (uVar8 == 0) {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"both streams prematurely drained\n",0x21);
        memmove(buffer + lVar9 + 0x90,local_58,sVar7);
        buffer_count->_M_elems[5] = -lVar9;
        check_input((uchar **)((long)buffer + (0x480 - sVar7)),-lVar9);
        goto LAB_0015e996;
      }
    }
    *(uchar **)((long)buffer + sVar7 + 0x280) = buffer[0x170 - uVar8];
    uVar8 = uVar8 - 1;
    *puVar1 = uVar8;
    lVar9 = lVar9 + -1;
    sVar7 = sVar7 + 8;
  } while (sVar7 != 0x200);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"buffer filled\n",0xe);
  buffer_count->_M_elems[5] = 0x40;
  check_input(local_58,0x40);
LAB_0015e996:
  anon_func::DI::~DI(&local_38);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}